

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix_test.cc
# Opt level: O0

void __thiscall
fizplex::ColMatrix_MatrixMultiplicationWithIdentity_Test::TestBody
          (ColMatrix_MatrixMultiplicationWithIdentity_Test *this)

{
  initializer_list<fizplex::SVector::Nonzero> l;
  initializer_list<fizplex::SVector::Nonzero> l_00;
  initializer_list<fizplex::SVector::Nonzero> l_01;
  initializer_list<fizplex::SVector> colList;
  bool bVar1;
  char *message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ColMatrix m;
  ColMatrix idnt;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  ColMatrix *in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  size_t in_stack_fffffffffffffdb8;
  SVector *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  ColMatrix *in_stack_fffffffffffffdd0;
  undefined1 ***pppuVar2;
  iterator in_stack_fffffffffffffdd8;
  undefined1 ***pppuVar3;
  size_type in_stack_fffffffffffffde0;
  AssertHelper local_218;
  Message local_210 [4];
  ColMatrix *in_stack_fffffffffffffe10;
  ColMatrix *in_stack_fffffffffffffe18;
  AssertionResult local_1e0;
  AssertHelper local_1d0;
  Message local_1c8 [6];
  AssertionResult local_198;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 *local_118;
  undefined8 local_110;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 local_c0;
  undefined1 **local_b8;
  undefined8 *local_b0 [3];
  undefined1 local_98 [24];
  undefined1 local_80 [24];
  undefined1 **local_68;
  undefined8 local_60;
  
  ColMatrix::identity(in_stack_fffffffffffffdb8);
  local_b8 = (undefined1 **)local_b0;
  local_d8 = 1;
  uStack_d0 = 0;
  local_e8 = 2;
  uStack_e0 = 0xc008000000000000;
  local_f8 = 0;
  uStack_f0 = 0x401c000000000000;
  local_c8 = &local_f8;
  local_c0 = 3;
  l._M_array._7_1_ = in_stack_fffffffffffffdcf;
  l._M_array._0_7_ = in_stack_fffffffffffffdc8;
  l._M_len = (size_type)in_stack_fffffffffffffdd0;
  SVector::SVector(in_stack_fffffffffffffdc0,l);
  local_b8 = (undefined1 **)local_98;
  local_128 = 2;
  uStack_120 = 0x4010000000000000;
  local_138 = 1;
  uStack_130 = 0x4008000000000000;
  local_148 = 0;
  uStack_140 = 0x4000000000000000;
  local_118 = &local_148;
  local_110 = 3;
  l_00._M_array._7_1_ = in_stack_fffffffffffffdcf;
  l_00._M_array._0_7_ = in_stack_fffffffffffffdc8;
  l_00._M_len = (size_type)in_stack_fffffffffffffdd0;
  SVector::SVector(in_stack_fffffffffffffdc0,l_00);
  local_b8 = (undefined1 **)local_80;
  local_168 = 2;
  uStack_160 = 0xc000000000000000;
  local_178 = 1;
  uStack_170 = 0xbff0000000000000;
  local_188 = 0;
  uStack_180 = 0x3ff0000000000000;
  local_158 = &local_188;
  local_150 = 3;
  l_01._M_array._7_1_ = in_stack_fffffffffffffdcf;
  l_01._M_array._0_7_ = in_stack_fffffffffffffdc8;
  l_01._M_len = (size_type)in_stack_fffffffffffffdd0;
  SVector::SVector(in_stack_fffffffffffffdc0,l_01);
  local_68 = (undefined1 **)local_b0;
  local_60 = 3;
  colList._M_len = in_stack_fffffffffffffde0;
  colList._M_array = in_stack_fffffffffffffdd8;
  ColMatrix::ColMatrix
            (in_stack_fffffffffffffdd0,CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8)
             ,(size_t)in_stack_fffffffffffffdc0,colList);
  pppuVar3 = (undefined1 ***)local_b0;
  pppuVar2 = &local_68;
  do {
    pppuVar2 = pppuVar2 + -3;
    SVector::~SVector((SVector *)0x1bbfed);
  } while (pppuVar2 != pppuVar3);
  ColMatrix::operator*(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  testing::internal::EqHelper<false>::Compare<fizplex::ColMatrix,fizplex::ColMatrix>
            (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (ColMatrix *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  ColMatrix::~ColMatrix((ColMatrix *)0x1bc05a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_198);
  if (!bVar1) {
    testing::Message::Message(local_1c8);
    in_stack_fffffffffffffd98 =
         (ColMatrix *)testing::AssertionResult::failure_message((AssertionResult *)0x1bc1a6);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x69,(char *)in_stack_fffffffffffffd98);
    testing::internal::AssertHelper::operator=(&local_1d0,local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::Message::~Message((Message *)0x1bc203);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1bc258);
  ColMatrix::operator*(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  testing::internal::EqHelper<false>::Compare<fizplex::ColMatrix,fizplex::ColMatrix>
            (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (ColMatrix *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  ColMatrix::~ColMatrix((ColMatrix *)0x1bc2a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
  if (!bVar1) {
    testing::Message::Message(local_210);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x1bc331);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x6a,message);
    testing::internal::AssertHelper::operator=(&local_218,local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    testing::Message::~Message((Message *)0x1bc37d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1bc3cc);
  ColMatrix::~ColMatrix((ColMatrix *)0x1bc3d9);
  ColMatrix::~ColMatrix((ColMatrix *)0x1bc3e6);
  return;
}

Assistant:

TEST(ColMatrix, MatrixMultiplicationWithIdentity) {
  const auto idnt = ColMatrix::identity(3);
  const ColMatrix m(3, 3,
                    {{{0, 7}, {2, -3}, {1, 0.0}},
                     {{0, 2}, {1, 3}, {2, 4}},
                     {{0, 1}, {1, -1}, {2, -2}}});
  EXPECT_EQ(m, idnt * m);
  EXPECT_EQ(m, m * idnt);
}